

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaEnumBuilder::key(QByteArray *__return_storage_ptr__,QMetaEnumBuilder *this,int index)

{
  QMetaEnumBuilderPrivate *pQVar1;
  pointer pQVar2;
  
  pQVar1 = d_func(this);
  if ((index < 0 || pQVar1 == (QMetaEnumBuilderPrivate *)0x0) ||
     ((ulong)(pQVar1->keys).d.size <= (ulong)(uint)index)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar2 = QList<QByteArray>::data(&pQVar1->keys);
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&pQVar2[(uint)index].d);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaEnumBuilder::key(int index) const
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d && index >= 0 && index < d->keys.size())
        return d->keys[index];
    else
        return QByteArray();
}